

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void generate_hole(chunk_conflict *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t feat)

{
  int y;
  int x;
  uint32_t uVar1;
  loc_conflict lVar2;
  wchar_t x0;
  wchar_t y0;
  wchar_t feat_local;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  chunk_conflict *c_local;
  
  y = (y1 + y2) / 2;
  x = (x1 + x2) / 2;
  if (c == (chunk_conflict *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                  ,0x198,"void generate_hole(struct chunk *, int, int, int, int, int)");
  }
  uVar1 = Rand_div(4);
  switch(uVar1) {
  case 0:
    lVar2 = (loc_conflict)loc(x,y1);
    square_set_feat((chunk *)c,lVar2,feat);
    break;
  case 1:
    lVar2 = (loc_conflict)loc(x1,y);
    square_set_feat((chunk *)c,lVar2,feat);
    break;
  case 2:
    lVar2 = (loc_conflict)loc(x,y2);
    square_set_feat((chunk *)c,lVar2,feat);
    break;
  case 3:
    lVar2 = (loc_conflict)loc(x2,y);
    square_set_feat((chunk *)c,lVar2,feat);
  }
  return;
}

Assistant:

static void generate_hole(struct chunk *c, int y1, int x1, int y2, int x2,
						  int feat)
{
	/* Find the center */
	int y0 = (y1 + y2) / 2;
	int x0 = (x1 + x2) / 2;

	assert(c);

	/* Open random side */
	switch (randint0(4)) {
	case 0: square_set_feat(c, loc(x0, y1), feat); break;
	case 1: square_set_feat(c, loc(x1, y0), feat); break;
	case 2: square_set_feat(c, loc(x0, y2), feat); break;
	case 3: square_set_feat(c, loc(x2, y0), feat); break;
	}
}